

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlogging.cpp
# Opt level: O0

void qt_message_output(QtMsgType msgType,QMessageLogContext *context,QString *message)

{
  int iVar1;
  QMessageLogContext *in_RDX;
  QtMsgType in_ESI;
  long in_FS_OFFSET;
  int backtraceFrames;
  QInternalMessageLogContext ctx;
  QMessageLogContext *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  QtMsgType in_stack_fffffffffffffe54;
  QInternalMessageLogContext *pQVar2;
  QInternalMessageLogContext *this;
  QString *in_stack_fffffffffffffe78;
  QInternalMessageLogContext local_148;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = &local_148;
  memset(pQVar2,0xaa,0x140);
  this = pQVar2;
  QMessageLogContext::QMessageLogContext(&pQVar2->super_QMessageLogContext);
  pQVar2 = (QInternalMessageLogContext *)&pQVar2->backtrace;
  std::optional<QVarLengthArray<void_*,_32LL>_>::optional
            ((optional<QVarLengthArray<void_*,_32LL>_> *)0x247259);
  iVar1 = QInternalMessageLogContext::initFrom
                    (this,(QMessageLogContext *)
                          CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
  if (iVar1 != 0) {
    QInternalMessageLogContext::populateBacktrace(pQVar2,(int)((ulong)this >> 0x20));
  }
  qt_message_print(in_ESI,in_RDX,in_stack_fffffffffffffe78);
  qt_maybe_message_fatal<QString_const&>
            (in_stack_fffffffffffffe54,in_stack_fffffffffffffe48,(QString *)0x2472df);
  QInternalMessageLogContext::~QInternalMessageLogContext((QInternalMessageLogContext *)0x2472eb);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void qt_message_output(QtMsgType msgType, const QMessageLogContext &context, const QString &message)
{
    QInternalMessageLogContext ctx(context);
    qt_message_print(msgType, ctx, message);
    qt_maybe_message_fatal(msgType, ctx, message);
}